

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::internal::format_decimal<unsigned_int,char,fmt::internal::NoThousandsSep>
               (long buffer,uint value,uint num_digits)

{
  uint uVar1;
  uint index;
  uint index_1;
  uint num_digits_local;
  uint value_local;
  char *buffer_local;
  
  index_1 = value;
  _num_digits_local = (char *)(buffer + (ulong)num_digits);
  while (99 < index_1) {
    uVar1 = (index_1 % 100) * 2;
    index_1 = index_1 / 100;
    _num_digits_local[-1] = BasicData<void>::DIGITS[uVar1 + 1];
    NoThousandsSep::operator()((NoThousandsSep *)((long)&buffer_local + 7),_num_digits_local + -1);
    _num_digits_local[-2] = BasicData<void>::DIGITS[uVar1];
    NoThousandsSep::operator()((NoThousandsSep *)((long)&buffer_local + 7),_num_digits_local + -2);
    _num_digits_local = _num_digits_local + -2;
  }
  if (index_1 < 10) {
    _num_digits_local[-1] = (char)index_1 + '0';
  }
  else {
    _num_digits_local[-1] = BasicData<void>::DIGITS[index_1 * 2 + 1];
    NoThousandsSep::operator()((NoThousandsSep *)((long)&buffer_local + 7),_num_digits_local + -1);
    _num_digits_local[-2] = BasicData<void>::DIGITS[index_1 * 2];
  }
  return;
}

Assistant:

inline void format_decimal(Char *buffer, UInt value, unsigned num_digits, ThousandsSep thousands_sep)
{
    buffer += num_digits;
    while (value >= 100)
    {
        // Integer division is slow so do it for a group of two digits instead
        // of for every digit. The idea comes from the talk by Alexandrescu
        // "Three Optimization Tips for C++". See speed-test for a comparison.
        unsigned index = static_cast<unsigned>((value % 100) * 2);
        value /= 100;
        *--buffer = Data::DIGITS[index + 1];
        thousands_sep(buffer);
        *--buffer = Data::DIGITS[index];
        thousands_sep(buffer);
    }
    if (value < 10)
    {
        *--buffer = static_cast<char>('0' + value);
        return;
    }
    unsigned index = static_cast<unsigned>(value * 2);
    *--buffer = Data::DIGITS[index + 1];
    thousands_sep(buffer);
    *--buffer = Data::DIGITS[index];
}